

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error write_book_kind(class_book *book,char *name)

{
  int iVar1;
  object_kind *poVar2;
  object_kind *__s;
  char *pcVar3;
  int local_34;
  wchar_t i;
  object_kind *kind;
  object_kind *temp;
  char *name_local;
  class_book *book_local;
  
  for (local_34 = 0; local_34 < (int)(uint)z_info->k_max; local_34 = local_34 + 1) {
    if ((k_info[local_34].name != (char *)0x0) &&
       (iVar1 = strcmp(name,k_info[local_34].name), iVar1 == 0)) {
      book->sval = k_info[local_34].sval;
      return PARSE_ERROR_NONE;
    }
  }
  z_info->k_max = z_info->k_max + 1;
  z_info->ordinary_kind_max = z_info->ordinary_kind_max + 1;
  poVar2 = (object_kind *)mem_realloc(k_info,(long)(int)(z_info->k_max + 1) * 0x2a0);
  if (poVar2 == (object_kind *)0x0) {
    book_local._4_4_ = PARSE_ERROR_INTERNAL;
  }
  else {
    __s = poVar2 + (int)(z_info->k_max - 1);
    k_info = poVar2;
    memset(__s,0,0x2a0);
    __s->tval = book->tval;
    __s->base = kb_info + __s->tval;
    pcVar3 = string_make(name);
    __s->name = pcVar3;
    __s->kidx = z_info->k_max - 1;
    for (local_34 = 0; local_34 < 0x24; local_34 = local_34 + 1) {
      if (kb_info[local_34].tval == __s->tval) {
        kb_info[local_34].num_svals = kb_info[local_34].num_svals + 1;
        __s->sval = kb_info[local_34].num_svals;
        break;
      }
    }
    if (local_34 == 0x24) {
      book_local._4_4_ = PARSE_ERROR_INTERNAL;
    }
    else {
      book->sval = __s->sval;
      __s->d_char = L'*';
      __s->d_attr = '\x04';
      __s->dd = 1;
      __s->ds = 1;
      __s->weight = 0x1e;
      flag_union(__s->kind_flags,kb_info[__s->tval].kind_flags,2);
      if ((book->dungeon & 1U) != 0) {
        for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
          __s->el_info[local_34].flags = __s->el_info[local_34].flags | 2;
        }
        flag_on_dbg(__s->kind_flags,2,7,"kind->kind_flags","KF_GOOD");
      }
      book_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return book_local._4_4_;
}

Assistant:

static enum parser_error write_book_kind(struct class_book *book,
										 const char *name)
{
	struct object_kind *temp, *kind;
	int i;

	/* Check we haven't already made this book */
	for (i = 0; i < z_info->k_max; i++) {
		if (k_info[i].name && streq(name, k_info[i].name)) {
			book->sval = k_info[i].sval;
			return PARSE_ERROR_NONE;
		}
	}

	/* Extend by 1 and realloc */
	z_info->k_max += 1;
	z_info->ordinary_kind_max += 1;
	temp = mem_realloc(k_info, (z_info->k_max + 1) * sizeof(*temp));

	/* Copy if no errors */
	if (!temp) {
		return PARSE_ERROR_INTERNAL;
	} else {
		k_info = temp;
	}

	/* Add this entry at the end */
	kind = &k_info[z_info->k_max - 1];
	memset(kind, 0, sizeof(*kind));

	/* Copy the tval and base */
	kind->tval = book->tval;
	kind->base = &kb_info[kind->tval];

	/* Make the name and index */
	kind->name = string_make(name);
	kind->kidx = z_info->k_max - 1;

	/* Increase the sval count for this tval, set the new one to the max */
	for (i = 0; i < TV_MAX; i++)
		if (kb_info[i].tval == kind->tval) {
			kb_info[i].num_svals++;
			kind->sval = kb_info[i].num_svals;
			break;
		}
	if (i == TV_MAX) return PARSE_ERROR_INTERNAL;

	/* Copy the sval to the artifact info */
	book->sval = kind->sval;

	/* Set object defaults (graphics should be overwritten) */
	kind->d_char = '*';
	kind->d_attr = COLOUR_RED;
	kind->dd = 1;
	kind->ds = 1;
	kind->weight = 30;

	/* Inherit base flags. */
	kf_union(kind->kind_flags, kb_info[kind->tval].kind_flags);

	/* Dungeon books get extra properties */
	if (book->dungeon) {
		for (i = ELEM_BASE_MIN; i < ELEM_BASE_MAX; i++) {
			kind->el_info[i].flags |= EL_INFO_IGNORE;
		}
		kf_on(kind->kind_flags, KF_GOOD);
	}

	return PARSE_ERROR_NONE;
}